

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

bool __thiscall
density::
conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
::empty(conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
        *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  *this_local;
  
  lock._M_device = &this->m_mutex;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_mutex);
  bVar1 = heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
          ::empty(&this->m_queue);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

bool empty() const noexcept
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            return m_queue.empty();
        }